

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::fail_string_as_integer(void)

{
  bool bVar1;
  error_code eVar2;
  int local_228 [2];
  error_category *local_220;
  undefined4 local_214;
  type_conflict4 local_210 [2];
  type local_208;
  undefined1 local_1e8 [8];
  error_code error_3;
  variable data_3;
  undefined4 local_194;
  type_conflict4 local_190 [2];
  type local_188;
  undefined1 local_168 [8];
  error_code error_2;
  variable data_2;
  undefined4 local_114;
  type_conflict4 local_110 [2];
  type local_108;
  undefined1 local_e8 [8];
  error_code error_1;
  variable data_1;
  int local_a0 [2];
  error_category *local_98;
  undefined4 local_88;
  type_conflict4 local_84 [5];
  type local_70;
  undefined1 local_48 [8];
  error_code error;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat,"alpha");
  std::error_code::error_code((error_code *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            (&local_70,(basic_variable<std::allocator<char>_> *)&error._M_cat,(error_code *)local_48
            );
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("data.value<string>(error)","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x178b,"void value_suite::fail_string_as_integer()",&local_70,"alpha");
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
  boost::detail::test_impl
            ("!error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x178c,"void value_suite::fail_string_as_integer()",!bVar1);
  local_84[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                          ((basic_variable<std::allocator<char>_> *)&error._M_cat,
                           (error_code *)local_48);
  local_88 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<int>(error)","int{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x178d,"void value_suite::fail_string_as_integer()",local_84,&local_88);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  local_98 = eVar2._M_cat;
  local_a0[0] = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x178e,"void value_suite::fail_string_as_integer()",local_48,local_a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat,L"bravo");
  std::error_code::error_code((error_code *)local_e8);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::wstring>
            (&local_108,(basic_variable<std::allocator<char>> *)&error_1._M_cat,
             (error_code *)local_e8);
  bVar1 = std::operator==(&local_108,L"bravo");
  boost::detail::test_impl
            ("data.value<std::wstring>(error) == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1793,"void value_suite::fail_string_as_integer()",bVar1);
  std::__cxx11::wstring::~wstring((wstring *)&local_108);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_e8);
  boost::detail::test_impl
            ("!error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1794,"void value_suite::fail_string_as_integer()",!bVar1);
  local_110[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                           ((basic_variable<std::allocator<char>_> *)&error_1._M_cat,
                            (error_code *)local_e8);
  local_114 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<int>(error)","int{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1795,"void value_suite::fail_string_as_integer()",local_110,&local_114);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  data_2.storage._40_4_ = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1796,"void value_suite::fail_string_as_integer()",local_e8,
             &data_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_2._M_cat,L"charlie");
  std::error_code::error_code((error_code *)local_168);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u16string>
            (&local_188,(basic_variable<std::allocator<char>> *)&error_2._M_cat,
             (error_code *)local_168);
  bVar1 = std::operator==(&local_188,L"charlie");
  boost::detail::test_impl
            ("data.value<std::u16string>(error) == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x179b,"void value_suite::fail_string_as_integer()",bVar1);
  std::__cxx11::u16string::~u16string((u16string *)&local_188);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_168);
  boost::detail::test_impl
            ("!error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x179c,"void value_suite::fail_string_as_integer()",!bVar1);
  local_190[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                           ((basic_variable<std::allocator<char>_> *)&error_2._M_cat,
                            (error_code *)local_168);
  local_194 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<int>(error)","int{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x179d,"void value_suite::fail_string_as_integer()",local_190,&local_194);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  data_3.storage._40_4_ = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x179e,"void value_suite::fail_string_as_integer()",local_168,
             &data_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_2._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_3._M_cat,L"delta");
  std::error_code::error_code((error_code *)local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u32string>
            (&local_208,(basic_variable<std::allocator<char>> *)&error_3._M_cat,
             (error_code *)local_1e8);
  bVar1 = std::operator==(&local_208,L"delta");
  boost::detail::test_impl
            ("data.value<std::u32string>(error) == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x17a3,"void value_suite::fail_string_as_integer()",bVar1);
  std::__cxx11::u32string::~u32string((u32string *)&local_208);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_1e8);
  boost::detail::test_impl
            ("!error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x17a4,"void value_suite::fail_string_as_integer()",!bVar1);
  local_210[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                           ((basic_variable<std::allocator<char>_> *)&error_3._M_cat,
                            (error_code *)local_1e8);
  local_214 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<int>(error)","int{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x17a5,"void value_suite::fail_string_as_integer()",local_210,&local_214);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  local_220 = eVar2._M_cat;
  local_228[0] = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x17a6,"void value_suite::fail_string_as_integer()",local_1e8,local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_3._M_cat);
  return;
}

Assistant:

void fail_string_as_integer()
{
    {
        variable data("alpha");
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<string>(error), "alpha");
        TRIAL_PROTOCOL_TEST(!error);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<int>(error), int{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data(L"bravo");
        std::error_code error;
        TRIAL_PROTOCOL_TEST(data.value<std::wstring>(error) == L"bravo");
        TRIAL_PROTOCOL_TEST(!error);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<int>(error), int{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data(u"charlie");
        std::error_code error;
        TRIAL_PROTOCOL_TEST(data.value<std::u16string>(error) == u"charlie");
        TRIAL_PROTOCOL_TEST(!error);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<int>(error), int{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data(U"delta");
        std::error_code error;
        TRIAL_PROTOCOL_TEST(data.value<std::u32string>(error) == U"delta");
        TRIAL_PROTOCOL_TEST(!error);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<int>(error), int{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
}